

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * unpack21_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  
  *out = (*in & 0x1fffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x15;
  out[1] = (uVar1 >> 0x15) + base + (in[1] & 0x3ff) * 0x800;
  out[2] = (in[1] >> 10 & 0x1fffff) + base;
  uVar2 = in[1];
  out[3] = -((int)uVar2 >> 0x1f);
  out[3] = -((int)uVar2 >> 0x1f) + base + (in[2] & 0xfffff) * 2;
  uVar1 = in[2];
  out[4] = uVar1 >> 0x14;
  out[4] = (uVar1 >> 0x14) + base + (in[3] & 0x1ff) * 0x1000;
  out[5] = (in[3] >> 9 & 0x1fffff) + base;
  uVar1 = in[3];
  out[6] = uVar1 >> 0x1e;
  out[6] = (uVar1 >> 0x1e) + base + (in[4] & 0x7ffff) * 4;
  uVar1 = in[4];
  out[7] = uVar1 >> 0x13;
  out[7] = (uVar1 >> 0x13) + base + (in[5] & 0xff) * 0x2000;
  return in + 6;
}

Assistant:

uint32_t * unpack21_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 21 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  21  ) ;
    ++in;
    *out |= ((*in) % (1U<< 10 ))<<( 21 - 10 );
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 21 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  31  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 21 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 9 ))<<( 21 - 9 );
    *out += base;
    out++;
    *out = ( (*in) >>  9  )   % (1U << 21 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 19 ))<<( 21 - 19 );
    *out += base;
    out++;
    *out = ( (*in) >>  19  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 21 - 8 );
    *out += base;
    out++;

    return in + 1;
}